

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# i2cscript.c
# Opt level: O0

void envy_bios_print_i2cscript(envy_bios *bios,FILE *out,uint mask)

{
  envy_bios_i2cscript *peVar1;
  envy_bios_i2cscript *i2cscript;
  uint mask_local;
  FILE *out_local;
  envy_bios *bios_local;
  
  peVar1 = &bios->i2cscript;
  if ((peVar1->bit != (envy_bios_bit_entry *)0x0) && ((mask & 0x800) != 0)) {
    if ((bios->i2cscript).valid == '\0') {
      fprintf((FILE *)out,"Failed to parse BIT table \'2\' at 0x%04x version 1\n\n",
              (ulong)peVar1->bit->t_offset);
    }
    else if ((((mask & 0x80000000) != 0) || ((bios->i2cscript).unk00 != 0)) ||
            ((bios->i2cscript).script != 0)) {
      fprintf((FILE *)out,"I2C script");
      if ((bios->i2cscript).unk00 != 0) {
        fprintf((FILE *)out," unk00 0x%04x",(ulong)(bios->i2cscript).unk00);
      }
      if ((bios->i2cscript).script != 0) {
        fprintf((FILE *)out,":");
      }
      fprintf((FILE *)out,"\n");
      envy_bios_dump_hex(bios,out,(uint)peVar1->bit->t_offset,(uint)peVar1->bit->t_len,mask);
      if ((bios->i2cscript).script != 0) {
        printscript((bios->i2cscript).script);
      }
      fprintf((FILE *)out,"\n");
    }
  }
  return;
}

Assistant:

void envy_bios_print_i2cscript (struct envy_bios *bios, FILE *out, unsigned mask) {
	struct envy_bios_i2cscript *i2cscript = &bios->i2cscript;
	if (!i2cscript->bit || !(mask & ENVY_BIOS_PRINT_I2CSCRIPT))
		return;
	if (!i2cscript->valid) {
		fprintf(out, "Failed to parse BIT table '2' at 0x%04x version 1\n\n", i2cscript->bit->t_offset);
		return;
	}
	if ((mask & ENVY_BIOS_PRINT_VERBOSE) || i2cscript->unk00 || i2cscript->script) {
		fprintf(out, "I2C script");
		if (i2cscript->unk00)
			fprintf(out, " unk00 0x%04x", i2cscript->unk00);
		if (i2cscript->script)
			fprintf(out, ":");
		fprintf(out, "\n");
		envy_bios_dump_hex(bios, out, i2cscript->bit->t_offset, i2cscript->bit->t_len, mask);
		if (i2cscript->script)
			printscript(i2cscript->script);
		fprintf(out, "\n");
	}
}